

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaSi.cpp
# Opt level: O2

PT __thiscall Hpipe::DaSi::find(DaSi *this,char c)

{
  PT PVar1;
  PT i;
  PT PVar2;
  
  for (PVar2 = 0;
      (PVar1 = *(PT *)(this + 8), *(PT *)(this + 8) != PVar2 &&
      (PVar1 = PVar2, *(char *)(*(long *)this + PVar2) != c)); PVar2 = PVar2 + 1) {
  }
  return PVar1;
}

Assistant:

PT DaSi::find( char c ) const {
    for( PT i = 0; ; ++i )
        if ( i == size or data[ i ] == c )
            return i;
}